

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderBMP.cpp
# Opt level: O1

IImage * __thiscall irr::video::CImageLoaderBMP::loadImage(CImageLoaderBMP *this,IReadFile *file)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ulong uVar3;
  s32 *palette;
  ulong uVar4;
  uint pitch;
  char *this_00;
  IImage *this_01;
  int iVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar7;
  float fVar8;
  u8 *bmpData;
  dimension2d<unsigned_int> dim;
  s32 *local_70;
  dimension2d<unsigned_int> local_68;
  short local_5e [5];
  uint local_54;
  uint local_4c;
  uint local_48;
  ushort local_42;
  uint local_40;
  uint local_3c;
  
  (**file->_vptr_IReadFile)(file,local_5e,0x36);
  if (local_5e[0] != 0x4d42) {
    return (IImage *)0x0;
  }
  if (2 < local_40) {
    this_00 = "Compression mode not supported.";
LAB_00201e16:
    os::Printer::log((Printer *)this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    return (IImage *)0x0;
  }
  if (((0x20 < local_42) || (23000 < local_4c)) || (23000 < local_48)) {
    this_00 = "Rejecting BMP with unreasonable size or BPP.";
    goto LAB_00201e16;
  }
  local_3c = (-local_3c & 3) + local_3c;
  iVar1 = (*file->_vptr_IReadFile[3])(file);
  uVar4 = (ulong)local_54 - CONCAT44(extraout_var,iVar1);
  uVar3 = uVar4 + 3;
  if (-1 < (long)uVar4) {
    uVar3 = uVar4;
  }
  iVar1 = (int)(uVar3 >> 2);
  if (iVar1 < 1) {
    palette = (s32 *)0x0;
  }
  else {
    iVar5 = 0x100;
    if (iVar1 < 0x100) {
      iVar5 = iVar1;
    }
    palette = (s32 *)operator_new__(0x400);
    memset(palette,0,0x400);
    (**file->_vptr_IReadFile)(file,palette,(ulong)(uint)(iVar5 << 2));
  }
  if (local_3c == 0) {
    iVar1 = (*file->_vptr_IReadFile[2])(file);
    local_3c = iVar1 - local_54;
  }
  (*file->_vptr_IReadFile[1])(file,(ulong)local_54,0);
  uVar3 = (ulong)local_3c;
  fVar8 = (float)local_42 * 0.125 * (float)local_4c;
  iVar1 = (int)fVar8 + (uint)((float)(int)fVar8 != fVar8);
  pitch = -iVar1 & 3;
  local_70 = (s32 *)operator_new__(uVar3);
  (**file->_vptr_IReadFile)(file,local_70,uVar3);
  if (local_40 == 2) {
    decompress4BitRLE((CImageLoaderBMP *)file,(u8 **)&local_70,local_3c,local_4c,local_48,pitch);
    uVar2 = local_4c + 1 >> 1;
    uVar6 = extraout_XMM0_Da_02;
    uVar7 = extraout_XMM0_Db_02;
  }
  else {
    uVar6 = extraout_XMM0_Da_00;
    uVar7 = extraout_XMM0_Db_00;
    if (local_40 != 1) goto LAB_00201f9d;
    decompress8BitRLE((CImageLoaderBMP *)file,(u8 **)&local_70,local_3c,local_4c,local_48,pitch);
    uVar6 = extraout_XMM0_Da_01;
    uVar7 = extraout_XMM0_Db_01;
    uVar2 = local_4c;
  }
  local_3c = (uVar2 + pitch) * local_48;
LAB_00201f9d:
  if (local_3c < (iVar1 + pitch) * local_48) {
    os::Printer::log((Printer *)"Bitmap data is cut off.",(double)CONCAT44(uVar7,uVar6));
    if (palette != (s32 *)0x0) {
      operator_delete__(palette);
    }
    if (local_70 == (s32 *)0x0) {
      return (IImage *)0x0;
    }
    operator_delete__(local_70);
    return (IImage *)0x0;
  }
  local_68.Width = local_4c;
  local_68.Height = local_48;
  this_01 = (IImage *)0x0;
  if (local_42 < 0x10) {
    if (local_42 == 1) {
      this_01 = (IImage *)operator_new(0x50);
      CImage::CImage((CImage *)this_01,ECF_A1R5G5B5,&local_68);
      CColorConverter::convert1BitTo16Bit
                ((u8 *)local_70,(s16 *)this_01->Data,local_4c,local_48,pitch,true);
    }
    else if (local_42 == 4) {
      this_01 = (IImage *)operator_new(0x50);
      CImage::CImage((CImage *)this_01,ECF_A1R5G5B5,&local_68);
      CColorConverter::convert4BitTo16Bit
                ((u8 *)local_70,(s16 *)this_01->Data,local_4c,local_48,palette,pitch,true);
    }
    else {
      this_01 = (IImage *)0x0;
      if (local_42 == 8) {
        this_01 = (IImage *)operator_new(0x50);
        CImage::CImage((CImage *)this_01,ECF_A1R5G5B5,&local_68);
        CColorConverter::convert8BitTo16Bit
                  ((u8 *)local_70,(s16 *)this_01->Data,local_4c,local_48,palette,pitch,true);
      }
    }
  }
  else if (local_42 == 0x10) {
    this_01 = (IImage *)operator_new(0x50);
    CImage::CImage((CImage *)this_01,ECF_A1R5G5B5,&local_68);
    CColorConverter::convert16BitTo16Bit
              ((s16 *)local_70,(s16 *)this_01->Data,local_4c,local_48,pitch,true);
  }
  else if (local_42 == 0x18) {
    this_01 = (IImage *)operator_new(0x50);
    CImage::CImage((CImage *)this_01,ECF_R8G8B8,&local_68);
    CColorConverter::convert24BitTo24Bit
              ((u8 *)local_70,this_01->Data,local_4c,local_48,pitch,true,true);
  }
  else if (local_42 == 0x20) {
    this_01 = (IImage *)operator_new(0x50);
    CImage::CImage((CImage *)this_01,ECF_A8R8G8B8,&local_68);
    CColorConverter::convert32BitTo32Bit(local_70,(s32 *)this_01->Data,local_4c,local_48,pitch,true)
    ;
  }
  if (palette != (s32 *)0x0) {
    operator_delete__(palette);
  }
  if (local_70 != (s32 *)0x0) {
    operator_delete__(local_70);
    return this_01;
  }
  return this_01;
}

Assistant:

IImage *CImageLoaderBMP::loadImage(io::IReadFile *file) const
{
	SBMPHeader header;

	file->read(&header, sizeof(header));

#ifdef __BIG_ENDIAN__
	header.Id = os::Byteswap::byteswap(header.Id);
	header.FileSize = os::Byteswap::byteswap(header.FileSize);
	header.BitmapDataOffset = os::Byteswap::byteswap(header.BitmapDataOffset);
	header.BitmapHeaderSize = os::Byteswap::byteswap(header.BitmapHeaderSize);
	header.Width = os::Byteswap::byteswap(header.Width);
	header.Height = os::Byteswap::byteswap(header.Height);
	header.Planes = os::Byteswap::byteswap(header.Planes);
	header.BPP = os::Byteswap::byteswap(header.BPP);
	header.Compression = os::Byteswap::byteswap(header.Compression);
	header.BitmapDataSize = os::Byteswap::byteswap(header.BitmapDataSize);
	header.PixelPerMeterX = os::Byteswap::byteswap(header.PixelPerMeterX);
	header.PixelPerMeterY = os::Byteswap::byteswap(header.PixelPerMeterY);
	header.Colors = os::Byteswap::byteswap(header.Colors);
	header.ImportantColors = os::Byteswap::byteswap(header.ImportantColors);
#endif

	s32 pitch = 0;

	//! return if the header is false

	if (header.Id != 0x4d42)
		return 0;

	if (header.Compression > 2) { // we'll only handle RLE-Compression
		os::Printer::log("Compression mode not supported.", ELL_ERROR);
		return 0;
	}

	if (header.BPP > 32 || !checkImageDimensions(header.Width, header.Height)) {
		os::Printer::log("Rejecting BMP with unreasonable size or BPP.", ELL_ERROR);
		return 0;
	}

	// adjust bitmap data size to dword boundary
	header.BitmapDataSize += (4 - (header.BitmapDataSize % 4)) % 4;

	// read palette

	long pos = file->getPos();
	constexpr s32 paletteAllocSize = 256;
	s32 paletteSize = (header.BitmapDataOffset - pos) / 4;
	paletteSize = core::clamp(paletteSize, 0, paletteAllocSize);

	s32 *paletteData = 0;
	if (paletteSize) {
		// always allocate an 8-bit palette to ensure enough space
		paletteData = new s32[paletteAllocSize];
		memset(paletteData, 0, paletteAllocSize * sizeof(s32));
		file->read(paletteData, paletteSize * sizeof(s32));
#ifdef __BIG_ENDIAN__
		for (s32 i = 0; i < paletteSize; ++i)
			paletteData[i] = os::Byteswap::byteswap(paletteData[i]);
#endif
	}

	// read image data

	if (!header.BitmapDataSize) {
		// okay, lets guess the size
		// some tools simply don't set it
		header.BitmapDataSize = static_cast<u32>(file->getSize()) - header.BitmapDataOffset;
	}

	file->seek(header.BitmapDataOffset);

	s32 widthInBytes;
	{
		f32 t = (header.Width) * (header.BPP / 8.0f);
		widthInBytes = (s32)t;
		t -= widthInBytes;
		if (t != 0.0f)
			++widthInBytes;
	}

	const s32 lineSize = widthInBytes + ((4 - (widthInBytes % 4))) % 4;
	pitch = lineSize - widthInBytes;

	u8 *bmpData = new u8[header.BitmapDataSize];
	file->read(bmpData, header.BitmapDataSize);

	// decompress data if needed
	switch (header.Compression) {
	case 1: // 8 bit rle
		decompress8BitRLE(bmpData, header.BitmapDataSize, header.Width, header.Height, pitch);
		header.BitmapDataSize = (header.Width + pitch) * header.Height;
		break;
	case 2: // 4 bit rle
		decompress4BitRLE(bmpData, header.BitmapDataSize, header.Width, header.Height, pitch);
		header.BitmapDataSize = ((header.Width + 1) / 2 + pitch) * header.Height;
		break;
	}

	if (header.BitmapDataSize < lineSize * header.Height) {
		os::Printer::log("Bitmap data is cut off.", ELL_ERROR);

		delete[] paletteData;
		delete[] bmpData;
		return 0;
	}

	// create surface
	core::dimension2d<u32> dim;
	dim.Width = header.Width;
	dim.Height = header.Height;

	IImage *image = 0;
	switch (header.BPP) {
	case 1:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert1BitTo16Bit(bmpData, (s16 *)image->getData(), header.Width, header.Height, pitch, true);
		break;
	case 4:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert4BitTo16Bit(bmpData, (s16 *)image->getData(), header.Width, header.Height, paletteData, pitch, true);
		break;
	case 8:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert8BitTo16Bit(bmpData, (s16 *)image->getData(), header.Width, header.Height, paletteData, pitch, true);
		break;
	case 16:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert16BitTo16Bit((s16 *)bmpData, (s16 *)image->getData(), header.Width, header.Height, pitch, true);
		break;
	case 24:
		image = new CImage(ECF_R8G8B8, dim);
		if (image)
			CColorConverter::convert24BitTo24Bit(bmpData, (u8 *)image->getData(), header.Width, header.Height, pitch, true, true);
		break;
	case 32: // thx to Reinhard Ostermeier
		image = new CImage(ECF_A8R8G8B8, dim);
		if (image)
			CColorConverter::convert32BitTo32Bit((s32 *)bmpData, (s32 *)image->getData(), header.Width, header.Height, pitch, true);
		break;
	};

	// clean up

	delete[] paletteData;
	delete[] bmpData;

	return image;
}